

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

bool flatbuffers::python::grpc::anon_unknown_0::ClientStreaming(RPCCall *method)

{
  bool bVar1;
  bool bVar2;
  Value *pVVar3;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"streaming",&local_31);
  pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(&(method->super_Definition).attributes,&local_30)
  ;
  std::__cxx11::string::~string((string *)&local_30);
  if (pVVar3 == (Value *)0x0) {
    bVar2 = false;
  }
  else {
    bVar1 = std::operator==(&pVVar3->constant,"client");
    bVar2 = true;
    if (!bVar1) {
      bVar2 = std::operator==(&pVVar3->constant,"bidi");
    }
  }
  return bVar2;
}

Assistant:

bool ClientStreaming(const RPCCall *method) {
  const Value *val = method->attributes.Lookup("streaming");
  return val != nullptr && (val->constant == "client" || val->constant == "bidi");
}